

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O0

bool __thiscall ON_Brep::HasSlits(ON_Brep *this,ON_BrepFace *F)

{
  bool bVar1;
  int iVar2;
  ON_BrepLoop *L;
  ON_BrepLoop *pL;
  int i;
  ON_BrepFace *F_local;
  ON_Brep *this_local;
  
  if (-1 < F->m_face_index) {
    for (pL._4_4_ = 0; iVar2 = ON_SimpleArray<int>::Count(&F->m_li), pL._4_4_ < iVar2;
        pL._4_4_ = pL._4_4_ + 1) {
      L = ON_BrepFace::Loop(F,pL._4_4_);
      if ((L != (ON_BrepLoop *)0x0) && (bVar1 = HasSlits(this,L), bVar1)) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ON_Brep::HasSlits(const ON_BrepFace& F) const

{
  if (F.m_face_index < 0)
    return false;
  int i;
  for (i=0; i<F.m_li.Count(); i++){
    const ON_BrepLoop* pL = F.Loop(i);
    if (!pL)
      continue;
    if (HasSlits(*pL))
      return true;
  }
  return false;
}